

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

void __thiscall
capnp::UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader
          (UnalignedFlatArrayMessageReader *this,ArrayPtr<const_capnp::word> array,
          ReaderOptions options)

{
  Array<kj::ArrayPtr<const_capnp::word>_> *this_00;
  uint uVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  word *pwVar9;
  ReaderOptions options_00;
  Fault f;
  
  uVar7 = array.size_;
  pwVar9 = array.ptr;
  options_00._8_8_ = options._8_8_ & 0xffffffff;
  options_00.traversalLimitInWords = options.traversalLimitInWords;
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__UnalignedFlatArrayMessageReader_00674bc8;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  this->end = pwVar9 + uVar7;
  if (uVar7 != 0) {
    this_00 = &this->moreSegments;
    uVar1 = (uint)pwVar9->content;
    uVar3 = uVar1 + 1;
    uVar4 = (ulong)((uVar3 >> 1) + 1);
    if (uVar7 < uVar4) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                 ,0x2b,FAILED,"array.size() >= offset",
                 "\"Message ends prematurely in segment table.\"",
                 (char (*) [43])"Message ends prematurely in segment table.");
      kj::_::Debug::Fault::~Fault(&f);
    }
    else {
      uVar5 = (ulong)*(uint *)((long)&pwVar9->content + 4);
      uVar8 = uVar5 + uVar4;
      if (uVar7 < uVar8) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                   ,0x33,FAILED,"array.size() >= offset + segmentSize",
                   "\"Message ends prematurely in first segment.\"",
                   (char (*) [43])"Message ends prematurely in first segment.");
        kj::_::Debug::Fault::~Fault(&f);
      }
      else {
        (this->segment0).ptr = pwVar9 + uVar4;
        (this->segment0).size_ = uVar5;
        if (1 < uVar3) {
          f.exception = (Exception *)
                        kj::_::HeapArrayDisposer::allocate<kj::ArrayPtr<capnp::word_const>>
                                  ((ulong)uVar1);
          kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
                    (this_00,(Array<kj::ArrayPtr<const_capnp::word>_> *)&f);
          kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array
                    ((Array<kj::ArrayPtr<const_capnp::word>_> *)&f);
          for (lVar6 = 0; (ulong)uVar3 * 4 + -4 != lVar6; lVar6 = lVar6 + 4) {
            uVar5 = (ulong)*(uint *)((long)&pwVar9[1].content + lVar6);
            uVar4 = uVar5 + uVar8;
            if (uVar7 < uVar4) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                        (&f,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
                         ,0x41,FAILED,"array.size() >= offset + segmentSize",
                         "\"Message ends prematurely.\"",(char (*) [26])"Message ends prematurely.")
              ;
              kj::Array<kj::ArrayPtr<const_capnp::word>_>::dispose(this_00);
              kj::_::Debug::Fault::~Fault(&f);
              return;
            }
            pAVar2 = this_00->ptr;
            *(word **)((long)&pAVar2->ptr + lVar6 * 4) = pwVar9 + uVar8;
            *(ulong *)((long)&pAVar2->size_ + lVar6 * 4) = uVar5;
            uVar8 = uVar4;
          }
        }
        this->end = pwVar9 + uVar8;
      }
    }
  }
  return;
}

Assistant:

UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader(
    kj::ArrayPtr<const word> array, ReaderOptions options)
    : MessageReader(options), end(array.end()) {
  if (array.size() < 1) {
    // Assume empty message.
    return;
  }

  const _::WireValue<uint32_t>* table =
      reinterpret_cast<const _::WireValue<uint32_t>*>(array.begin());

  uint segmentCount = table[0].get() + 1;
  size_t offset = segmentCount / 2u + 1u;

  KJ_REQUIRE(array.size() >= offset, "Message ends prematurely in segment table.") {
    return;
  }

  {
    uint segmentSize = table[1].get();

    KJ_REQUIRE(array.size() >= offset + segmentSize,
               "Message ends prematurely in first segment.") {
      return;
    }

    segment0 = array.slice(offset, offset + segmentSize);
    offset += segmentSize;
  }

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);

    for (uint i = 1; i < segmentCount; i++) {
      uint segmentSize = table[i + 1].get();

      KJ_REQUIRE(array.size() >= offset + segmentSize, "Message ends prematurely.") {
        moreSegments = nullptr;
        return;
      }

      moreSegments[i - 1] = array.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  end = array.begin() + offset;
}